

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O3

void __thiscall
FIX::double_conversion::FillDigits32
          (double_conversion *this,uint32_t number,Vector<char> buffer,int *length)

{
  uint uVar1;
  undefined1 uVar2;
  int iVar3;
  uint *puVar4;
  int iVar5;
  undefined4 in_register_00000034;
  long lVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  undefined1 *puVar10;
  uint uVar11;
  
  lVar6 = CONCAT44(in_register_00000034,number);
  puVar4 = buffer._8_8_;
  iVar3 = 0;
  iVar5 = (int)buffer.start_;
  if ((int)this != 0) {
    do {
      uVar9 = *puVar4 + iVar3;
      if (((int)uVar9 < 0) || (iVar5 <= (int)uVar9)) goto LAB_00163e11;
      uVar7 = (uint)this;
      *(byte *)(lVar6 + (ulong)uVar9) =
           (char)this + (char)(((ulong)this & 0xffffffff) / 10) * -10 | 0x30;
      iVar3 = iVar3 + 1;
      this = (double_conversion *)(((ulong)this & 0xffffffff) / 10);
    } while (9 < uVar7);
  }
  uVar9 = *puVar4;
  uVar7 = uVar9 + iVar3;
  if ((int)uVar9 < (int)(uVar9 + iVar3 + -1)) {
    puVar10 = (undefined1 *)(lVar6 + (ulong)uVar9);
    uVar11 = uVar9;
    do {
      if ((((int)uVar9 < 0) || (iVar5 <= (int)uVar11)) || (iVar5 < (int)uVar7)) {
LAB_00163e11:
        __assert_fail("0 <= index && index < length_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                      ,0xca,
                      "T &FIX::double_conversion::Vector<char>::operator[](int) const [T = char]");
      }
      uVar1 = uVar7 - 1;
      uVar2 = *puVar10;
      *puVar10 = *(undefined1 *)(lVar6 + (ulong)uVar1);
      *(undefined1 *)(lVar6 + (ulong)uVar1) = uVar2;
      iVar8 = uVar7 - 2;
      uVar11 = uVar11 + 1;
      puVar10 = puVar10 + 1;
      uVar7 = uVar1;
    } while ((int)uVar11 < iVar8);
    uVar7 = iVar3 + *puVar4;
  }
  *puVar4 = uVar7;
  return;
}

Assistant:

static void FillDigits32(uint32_t number, Vector<char> buffer, int* length) {
  int number_length = 0;
  // We fill the digits in reverse order and exchange them afterwards.
  while (number != 0) {
    int digit = number % 10;
    number /= 10;
    buffer[(*length) + number_length] = static_cast<char>('0' + digit);
    number_length++;
  }
  // Exchange the digits.
  int i = *length;
  int j = *length + number_length - 1;
  while (i < j) {
    char tmp = buffer[i];
    buffer[i] = buffer[j];
    buffer[j] = tmp;
    i++;
    j--;
  }
  *length += number_length;
}